

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedNames.cpp
# Opt level: O0

void __thiscall wasm::RemoveUnusedNames::visitFunction(RemoveUnusedNames *this,Function *curr)

{
  bool bVar1;
  Function *curr_local;
  RemoveUnusedNames *this_local;
  
  std::
  map<wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
  ::erase(&this->branchesSeen,(key_type *)&DELEGATE_CALLER_TARGET);
  bVar1 = std::
          map<wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
          ::empty(&this->branchesSeen);
  if (!bVar1) {
    __assert_fail("branchesSeen.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedNames.cpp"
                  ,0x62,"void wasm::RemoveUnusedNames::visitFunction(Function *)");
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    // When we reach the function body we can erase delegations to the caller.
    branchesSeen.erase(DELEGATE_CALLER_TARGET);
    assert(branchesSeen.empty());
  }